

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_constructor_test.h
# Opt level: O1

void __thiscall
phmap::priv::gtest_suite_ConstructorTest_::
AssignmentFromInitializerList<phmap::flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>_>
::TestBody(AssignmentFromInitializerList<phmap::flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>_>
           *this)

{
  flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  *m_00;
  char *message;
  Generator<std::pair<const_int,_int>,_void> gen;
  AssertionResult gtest_ar;
  TypeParam m;
  Generator<std::pair<const_int,_int>,_void> local_119;
  key_equal local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_108;
  undefined4 local_f0;
  slot_type *local_e8;
  size_t sStack_e0;
  size_t local_d8;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  local_d0;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  local_88;
  allocator_type local_40;
  pair<const_int,_int> local_38;
  pair<const_int,_int> local_30;
  pair<const_int,_int> local_28;
  pair<const_int,_int> local_20;
  pair<const_int,_int> local_18;
  
  local_38 = hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(&local_119);
  local_30 = hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(&local_119);
  local_28 = hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(&local_119);
  local_20 = hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(&local_119);
  local_18 = hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(&local_119);
  local_88.size_ = 0;
  local_88.capacity_ = 0;
  local_88.ctrl_ = (ctrl_t *)0x0;
  local_88.slots_ = (slot_type *)0x0;
  local_108.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
                 next_id<phmap::priv::StatefulTestingHash>()::gId.id_ + 1);
  local_118.super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (WithId<phmap::priv::StatefulTestingEqual>)
       (hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
        next_id<phmap::priv::StatefulTestingEqual>()::gId.id_ + 1);
  local_88.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  .
  super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  .super__Tuple_impl<3UL,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>.
  super__Head_base<3UL,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_false>._M_head_impl.id_ =
       (_Head_base<3UL,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_false>)
       (Alloc<std::pair<const_int,_int>_>)0x0;
  local_88.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  .
  super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  .super__Head_base<2UL,_phmap::priv::StatefulTestingEqual,_false>._M_head_impl.
  super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (StatefulTestingEqual)
       (StatefulTestingEqual)
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId.id_;
  local_88.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  .super__Head_base<1UL,_phmap::priv::StatefulTestingHash,_false>._M_head_impl.
  super_WithId<phmap::priv::StatefulTestingHash>.id_ =
       (StatefulTestingHash)
       (StatefulTestingHash)
       hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
       next_id<phmap::priv::StatefulTestingHash>()::gId.id_;
  local_88.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId.id_ =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
       next_id<phmap::priv::StatefulTestingHash>()::gId.id_ + 2;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId.id_ =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId.id_ + 2;
  local_40.id_ = 0;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
  ::raw_hash_set<std::pair<int_const,int>const*>
            ((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
              *)&local_d0,&local_38,(pair<const_int,_int> *)&stack0xfffffffffffffff0,0,
             (hasher *)&local_108,&local_118,&local_40);
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::move_assign(&local_88,&local_d0);
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::destroy_slots(&local_d0);
  local_f0 = 3;
  std::vector<std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>>::
  vector<std::pair<int_const,int>const*,void>
            ((vector<std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>> *)&local_e8,
             &local_38,(pair<const_int,_int> *)&stack0xfffffffffffffff0,(allocator_type *)&local_108
            );
  local_d0.capacity_ = local_d8;
  local_d0.size_ = sStack_e0;
  local_d0.slots_ = local_e8;
  local_e8 = (slot_type *)0x0;
  sStack_e0 = 0;
  local_d8 = 0;
  local_d0.ctrl_._0_4_ = local_f0;
  items<phmap::flat_hash_map<int,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>>
            (&local_108,(priv *)&local_88,m_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<int_const,int>>>
  ::operator()(&local_118,(char *)&local_d0,
               (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)"items(m)");
  if (local_108.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d0.slots_ != (slot_type *)0x0) {
    operator_delete(local_d0.slots_,local_d0.capacity_ - (long)local_d0.slots_);
  }
  if (local_e8 != (slot_type *)0x0) {
    operator_delete(local_e8,local_d8 - (long)local_e8);
  }
  if ((char)local_118.super_WithId<phmap::priv::StatefulTestingEqual>.id_ == '\0') {
    testing::Message::Message((Message *)&local_d0);
    if (local_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x1b6,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if ((long *)CONCAT44(local_d0.ctrl_._4_4_,local_d0.ctrl_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_d0.ctrl_._4_4_,local_d0.ctrl_._0_4_) + 8))();
    }
  }
  if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_110,local_110);
  }
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::destroy_slots(&local_88);
  return;
}

Assistant:

TYPED_TEST_P(ConstructorTest, AssignmentFromInitializerList) {
  using T = hash_internal::GeneratedType<TypeParam>;
  hash_internal::Generator<T> gen;
  std::initializer_list<T> values = {gen(), gen(), gen(), gen(), gen()};
  TypeParam m;
  m = values;
  EXPECT_THAT(items(m), ::testing::UnorderedElementsAreArray(values));
}